

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O3

ze_result_t
zeGetFabricVertexExpProcAddrTable
          (ze_api_version_t version,ze_fabric_vertex_exp_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  ze_pfnFabricVertexGetExp_t p_Var3;
  ze_pfnFabricVertexGetSubVerticesExp_t p_Var4;
  ze_pfnFabricVertexGetDeviceExp_t p_Var5;
  ze_result_t zVar6;
  code *pcVar7;
  iterator __begin1;
  undefined8 *puVar8;
  ze_fabric_vertex_exp_dditable_t dditable;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  puVar8 = *(undefined8 **)(loader::context + 0x15e0);
  puVar1 = *(undefined8 **)(loader::context + 0x15e8);
  if (puVar1 == puVar8) {
LAB_001af273:
    zVar6 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    if (pDdiTable == (ze_fabric_vertex_exp_dditable_t *)0x0) {
      return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    if (*(int *)(loader::context + 0x15c0) < (int)version) {
      return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    }
    zVar6 = ZE_RESULT_SUCCESS;
    do {
      if ((*(int *)(puVar8 + 1) == 0) &&
         (pcVar7 = (code *)dlsym(*puVar8,"zeGetFabricVertexExpProcAddrTable"), pcVar7 != (code *)0x0
         )) {
        zVar6 = (*pcVar7)(version,puVar8 + 199);
      }
      puVar8 = puVar8 + 0x1b3;
    } while (puVar8 != puVar1);
    if (zVar6 != ZE_RESULT_SUCCESS) {
      return zVar6;
    }
    lVar2 = *(long *)(loader::context + 0x15e0);
    if (((ulong)((*(long *)(loader::context + 0x15e8) - lVar2 >> 3) * 0x7aff6957aff6957b) < 2) &&
       (*(char *)(loader::context + 0x1629) != '\x01')) {
      p_Var3 = *(ze_pfnFabricVertexGetExp_t *)(lVar2 + 0x638);
      p_Var4 = *(ze_pfnFabricVertexGetSubVerticesExp_t *)(lVar2 + 0x640);
      p_Var5 = *(ze_pfnFabricVertexGetDeviceExp_t *)(lVar2 + 0x650);
      pDdiTable->pfnGetPropertiesExp = *(ze_pfnFabricVertexGetPropertiesExp_t *)(lVar2 + 0x648);
      pDdiTable->pfnGetDeviceExp = p_Var5;
      pDdiTable->pfnGetExp = p_Var3;
      pDdiTable->pfnGetSubVerticesExp = p_Var4;
    }
    else {
      pDdiTable->pfnGetExp = loader::zeFabricVertexGetExp;
      pDdiTable->pfnGetSubVerticesExp = loader::zeFabricVertexGetSubVerticesExp;
      pDdiTable->pfnGetPropertiesExp = loader::zeFabricVertexGetPropertiesExp;
      pDdiTable->pfnGetDeviceExp = loader::zeFabricVertexGetDeviceExp;
    }
    if (*(long *)(loader::context + 0x1618) != 0) {
      pcVar7 = (code *)dlsym(*(long *)(loader::context + 0x1618),"zeGetFabricVertexExpProcAddrTable"
                            );
      if (pcVar7 == (code *)0x0) goto LAB_001af273;
      zVar6 = (*pcVar7)(version,pDdiTable);
      if (zVar6 != ZE_RESULT_SUCCESS) {
        return zVar6;
      }
    }
    if (*(long *)(loader::context + 0x1620) == 0) {
      zVar6 = ZE_RESULT_SUCCESS;
    }
    else {
      pcVar7 = (code *)dlsym(*(long *)(loader::context + 0x1620),"zeGetFabricVertexExpProcAddrTable"
                            );
      zVar6 = ZE_RESULT_ERROR_UNINITIALIZED;
      if (pcVar7 != (code *)0x0) {
        local_58 = *(undefined4 *)&pDdiTable->pfnGetExp;
        uStack_54 = *(undefined4 *)((long)&pDdiTable->pfnGetExp + 4);
        uStack_50 = *(undefined4 *)&pDdiTable->pfnGetSubVerticesExp;
        uStack_4c = *(undefined4 *)((long)&pDdiTable->pfnGetSubVerticesExp + 4);
        local_48 = *(undefined4 *)&pDdiTable->pfnGetPropertiesExp;
        uStack_44 = *(undefined4 *)((long)&pDdiTable->pfnGetPropertiesExp + 4);
        uStack_40 = *(undefined4 *)&pDdiTable->pfnGetDeviceExp;
        uStack_3c = *(undefined4 *)((long)&pDdiTable->pfnGetDeviceExp + 4);
        zVar6 = (*pcVar7)(version,&local_58);
        lVar2 = loader::context;
        *(undefined4 *)(loader::context + 0x1c80) = local_58;
        *(undefined4 *)(lVar2 + 0x1c84) = uStack_54;
        *(undefined4 *)(lVar2 + 0x1c88) = uStack_50;
        *(undefined4 *)(lVar2 + 0x1c8c) = uStack_4c;
        *(undefined4 *)(lVar2 + 0x1c90) = local_48;
        *(undefined4 *)(lVar2 + 0x1c94) = uStack_44;
        *(undefined4 *)(lVar2 + 0x1c98) = uStack_40;
        *(undefined4 *)(lVar2 + 0x1c9c) = uStack_3c;
        if (*(char *)(lVar2 + 0x1652) == '\x01') {
          zVar6 = (*pcVar7)(version,pDdiTable);
        }
      }
    }
  }
  return zVar6;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetFabricVertexExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_fabric_vertex_exp_dditable_t* pDdiTable      ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<ze_pfnGetFabricVertexExpProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zeGetFabricVertexExpProcAddrTable") );
        if(!getTable) 
            continue; 
        result = getTable( version, &drv.dditable.ze.FabricVertexExp);
    }


    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnGetExp                                   = loader::zeFabricVertexGetExp;
            pDdiTable->pfnGetSubVerticesExp                        = loader::zeFabricVertexGetSubVerticesExp;
            pDdiTable->pfnGetPropertiesExp                         = loader::zeFabricVertexGetPropertiesExp;
            pDdiTable->pfnGetDeviceExp                             = loader::zeFabricVertexGetDeviceExp;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.ze.FabricVertexExp;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetFabricVertexExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zeGetFabricVertexExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    // If the API tracing layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->tracingLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetFabricVertexExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->tracingLayer, "zeGetFabricVertexExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        ze_fabric_vertex_exp_dditable_t dditable;
        memcpy(&dditable, pDdiTable, sizeof(ze_fabric_vertex_exp_dditable_t));
        result = getTable( version, &dditable );
        loader::context->tracing_dditable.ze.FabricVertexExp = dditable;
        if ( loader::context->tracingLayerEnabled ) {
            result = getTable( version, pDdiTable );
        }
    }

    return result;
}